

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O3

void __thiscall sf::priv::RenderTextureImplFBO::RenderTextureImplFBO(RenderTextureImplFBO *this)

{
  _Rb_tree_header *p_Var1;
  Lock lock;
  Lock local_30;
  map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  *local_28;
  
  (this->super_RenderTextureImpl)._vptr_RenderTextureImpl =
       (_func_int **)&PTR__RenderTextureImpl_0016b828;
  GlResource::GlResource((GlResource *)this);
  (this->super_RenderTextureImpl)._vptr_RenderTextureImpl =
       (_func_int **)&PTR__RenderTextureImplFBO_0016b7b8;
  p_Var1 = &(this->m_frameBuffers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_frameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_frameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_frameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_frameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_frameBuffers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_multisampleFrameBuffers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_multisampleFrameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_multisampleFrameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_multisampleFrameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_multisampleFrameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_multisampleFrameBuffers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_depthStencilBuffer = 0;
  this->m_colorBuffer = 0;
  this->m_width = 0;
  this->m_height = 0;
  this->m_context = (Context *)0x0;
  *(undefined8 *)((long)&this->m_context + 6) = 0;
  Lock::Lock(&local_30,(Mutex *)&(anonymous_namespace)::mutex);
  GlResource::registerContextDestroyCallback
            (anon_unknown.dwarf_bd5a6::contextDestroyCallback,(void *)0x0);
  local_28 = &this->m_frameBuffers;
  std::
  _Rb_tree<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*,std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*,std::_Identity<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>,std::less<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>,std::allocator<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>>
  ::
  _M_insert_unique<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>
            ((_Rb_tree<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*,std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*,std::_Identity<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>,std::less<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>,std::allocator<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>>
              *)(anonymous_namespace)::frameBuffers,&local_28);
  local_28 = &this->m_multisampleFrameBuffers;
  std::
  _Rb_tree<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*,std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*,std::_Identity<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>,std::less<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>,std::allocator<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>>
  ::
  _M_insert_unique<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>
            ((_Rb_tree<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*,std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*,std::_Identity<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>,std::less<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>,std::allocator<std::map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>*>>
              *)(anonymous_namespace)::frameBuffers,&local_28);
  Lock::~Lock(&local_30);
  return;
}

Assistant:

RenderTextureImplFBO::RenderTextureImplFBO() :
m_depthStencilBuffer(0),
m_colorBuffer       (0),
m_width             (0),
m_height            (0),
m_context           (NULL),
m_textureId         (0),
m_multisample       (false),
m_stencil           (false)
{
    Lock lock(mutex);

    // Register the context destruction callback
    registerContextDestroyCallback(contextDestroyCallback, 0);

    // Insert the new frame buffer mapping into the set of all active mappings
    frameBuffers.insert(&m_frameBuffers);
    frameBuffers.insert(&m_multisampleFrameBuffers);
}